

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O2

bool ON_EvaluateQuotientRule3(int dim,int der_count,int v_stride,double *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  double *pdVar17;
  int iVar18;
  uint i;
  int iVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  int i_00;
  int i_01;
  long lVar24;
  long lVar25;
  ulong uVar26;
  bool bVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  int local_b8;
  
  dVar1 = v[dim];
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    for (lVar16 = 0;
        ((der_count + 3) * (der_count + 2) * (der_count + 1) * v_stride) / 6 != (int)lVar16;
        lVar16 = lVar16 + 1) {
      v[lVar16] = v[lVar16] * (1.0 / dVar1);
    }
    if (der_count != 0) {
      lVar16 = (long)v_stride;
      dVar28 = v[lVar16 + dim];
      dVar30 = -dVar28;
      dVar29 = v[lVar16 + (v_stride + dim)];
      dVar31 = -dVar29;
      lVar21 = (long)(dim + v_stride * 2);
      dVar2 = v[lVar16 + lVar21];
      dVar32 = -dVar2;
      lVar20 = (long)(v_stride * 2);
      pdVar17 = v;
      iVar18 = dim;
      while (bVar27 = iVar18 != 0, iVar18 = iVar18 + -1, bVar27) {
        dVar3 = *pdVar17;
        pdVar17[lVar16] = dVar30 * dVar3 + pdVar17[lVar16];
        pdVar17[lVar16 * 2] = dVar31 * dVar3 + pdVar17[lVar16 * 2];
        pdVar17[lVar16 + lVar20] = dVar3 * dVar32 + pdVar17[lVar16 + lVar20];
        pdVar17 = pdVar17 + 1;
      }
      if (1 < der_count) {
        lVar24 = (long)(v_stride * 4);
        dVar3 = v[lVar24 + dim];
        dVar4 = v[lVar24 + (v_stride + dim)];
        dVar5 = v[lVar24 + lVar21];
        dVar6 = v[lVar24 + (v_stride * 3 + dim)];
        dVar7 = v[lVar24 + (dim + v_stride * 4)];
        iVar18 = v_stride * 5;
        dVar8 = v[lVar24 + (iVar18 + dim)];
        lVar21 = (long)(v_stride * 3);
        for (lVar25 = 0; dim != (int)lVar25; lVar25 = lVar25 + 1) {
          dVar9 = v[lVar16 + lVar25];
          dVar10 = v[lVar20 + lVar25];
          dVar11 = v[lVar21 + lVar25];
          dVar12 = v[lVar25];
          v[lVar24 + lVar25] = -dVar3 * dVar12 + dVar28 * -2.0 * dVar9 + v[lVar24 + lVar25];
          v[lVar16 + lVar24 + lVar25] =
               dVar31 * dVar9 + -dVar4 * dVar12 + dVar10 * dVar30 + v[lVar16 + lVar24 + lVar25];
          v[lVar24 + lVar20 + lVar25] =
               dVar9 * dVar32 + -dVar5 * dVar12 + dVar11 * dVar30 + v[lVar24 + lVar20 + lVar25];
          v[lVar24 + lVar21 + lVar25] =
               -dVar6 * dVar12 + dVar29 * -2.0 * dVar10 + v[lVar24 + lVar21 + lVar25];
          v[lVar24 * 2 + lVar25] =
               dVar10 * dVar32 + -dVar7 * dVar12 + dVar11 * dVar31 + v[lVar24 * 2 + lVar25];
          v[(long)iVar18 + lVar24 + lVar25] =
               dVar12 * -dVar8 + dVar2 * -2.0 * dVar11 + v[(long)iVar18 + lVar24 + lVar25];
        }
        if (der_count != 2) {
          uVar26 = 0;
          if (0 < dim) {
            uVar26 = (ulong)(uint)dim;
          }
          pdVar17 = v + v_stride * 10;
          for (iVar18 = 3; iVar22 = iVar18, iVar18 != der_count + 1; iVar18 = iVar18 + 1) {
            for (; -1 < iVar22; iVar22 = iVar22 + -1) {
              local_b8 = 0;
              for (iVar19 = iVar18 - iVar22; -1 < iVar19; iVar19 = iVar19 + -1) {
                iVar13 = (iVar18 - iVar22) - iVar19;
                for (i_00 = 0; i_00 <= iVar22; i_00 = i_00 + 1) {
                  dVar28 = ON_BinomialCoefficient(i_00,iVar22 - i_00);
                  for (i_01 = 0; i_01 <= iVar19; i_01 = i_01 + 1) {
                    dVar29 = ON_BinomialCoefficient(i_01,iVar19 - i_01);
                    i = (uint)(i_01 == 0 && i_00 == 0);
                    iVar15 = local_b8 - i;
                    for (; (int)i <= iVar13; i = i + 1) {
                      iVar23 = i_01 + i_00 + i;
                      dVar30 = ON_BinomialCoefficient(i,iVar13 - i);
                      dVar2 = v[(int)(((((iVar23 - i_00) + 1) * (iVar23 - i_00)) / 2 + i +
                                      ((iVar23 + 2) * (i_01 + i_00 + i + 1) * iVar23) / 6) *
                                      v_stride + dim)];
                      iVar23 = iVar18 - iVar23;
                      for (uVar14 = 0; uVar26 != uVar14; uVar14 = uVar14 + 1) {
                        pdVar17[uVar14] =
                             v[(long)(((((iVar23 - iVar22) + i_00 + 1) * ((iVar23 - iVar22) + i_00))
                                       / 2 + iVar15 + ((iVar23 + 2) * (iVar23 + 1) * iVar23) / 6) *
                                     v_stride) + uVar14] * dVar30 * dVar29 * -dVar28 * dVar2 +
                             pdVar17[uVar14];
                      }
                      iVar15 = iVar15 + -1;
                    }
                  }
                }
                pdVar17 = pdVar17 + lVar16;
                local_b8 = local_b8 + 1;
              }
            }
          }
        }
      }
    }
  }
  return (bool)(-(dVar1 != 0.0) & 1);
}

Assistant:

bool ON_EvaluateQuotientRule3( int dim, int der_count, int v_stride, double *v )
{
  double
    F, Fr, Fs, Ft, wr, ws, wt, wrr, wrs, wrt, wss, wst, wtt, *f, *x;
  int
    i, j, k, n;

  // comment notation:
  //   X = value of numerator
  //   W = value of denominator
  //   F = X/W
  //   Xr = partial w.r.t. 1st parameter
  //   Xs = partial w.r.t. 2nd parameter
  //   Xt = partial w.r.t. 3rd parameter 
  //   ...

	// divide everything by the weight
  F = v[dim];
  if (F == 0.0)
    return false;
  F = 1.0/F;
  n = der_count+1;
  i = v_stride*n*(n+1)*(n+2)/6;
  x = v;
  while(i--) 
    *x++ *= F;

  if (der_count) 
  {
		// first derivatives
    f = v;                   // f = F
    x = v + v_stride;        // x = Xr/w, x[v_stride] = Xs/w
    wr = -x[dim];            // wr = -Wr/w
    ws = -x[dim+v_stride];   // ws = -Ws/w
    wt = -x[dim+2*v_stride]; // wt = -Wt/w
    j = dim; 
		while (j--) 
    {
			F = *f++;
			x[0]          += wr*F;
			x[v_stride]   += ws*F;
			x[2*v_stride] += wt*F;
			x++;
		}

    if (der_count> 1) 
    {
      // 2nd derivatives
      f = v;                // f = F, f[v_stride] = Fr, f[2*v_stride] = Fs, f[3*v_stride] = Ft
      x = v + 4*v_stride;   // x = Xrr, x[v_strde] = Xrs, ...
      wrr = -x[dim];
			wrs = -x[dim+v_stride];
			wrt = -x[dim+2*v_stride];
			wss = -x[dim+3*v_stride];
			wst = -x[dim+4*v_stride];
			wtt = -x[dim+5*v_stride];
      j = dim; 
			while(j--) 
      {
				Fr = f[v_stride];
				Fs = f[2*v_stride];
				Ft = f[3*v_stride];
				F = *f++;
				x[0]          += wrr*F + 2.0*wr*Fr;     // Drr
				x[v_stride]   += wrs*F + wr*Fs + ws*Fr; // Drs
				x[2*v_stride] += wrt*F + wr*Ft + wt*Fr; // Drt
				x[3*v_stride] += wss*F + 2.0*ws*Fs;     // Dss
				x[4*v_stride] += wst*F + ws*Ft + wt*Fs; // Dst
				x[5*v_stride] += wtt*F + 2.0*wt*Ft;     // Dtt
				x++;
			}

      if ( der_count > 2 )
      {
        int ii, jj, kk, Fn, q;
        f = v + 10*v_stride; // f = Xrrr
        for ( n = 3; n <= der_count; n++ ) 
        {
          for ( i = n; i >= 0; i-- ) 
          {
            for ( j = n-i; j >= 0; j-- )
            {
              k = n-i-j;
              // f = Dr^i Ds^j Dt^k
              for ( ii = 0; ii <= i; ii++ ) 
              {
                wr = ON_BinomialCoefficient(ii,i-ii);
                for ( jj = 0; jj <= j; jj++ ) 
                {
                  ws = wr*ON_BinomialCoefficient(jj,j-jj);
                  for ( kk = (ii||jj)?0:1; kk <= k; kk++ ) 
                  {
                    q = ii+jj+kk;
                    Fn=q-ii;
                    Fn = v_stride*( q*(q+1)*(q+2)/6  +  Fn*(Fn+1)/2  +  kk )+dim;
                    // wt = -(i choose ii)*(j choose jj)*(k choose kk)*W(ii,jj,kk)
                    wt = -ws*ON_BinomialCoefficient(kk,k-kk)*v[Fn];
                    q = n-q;
                    Fn = q-i+ii;
                    // F(i-ii,j-jj,k-kk) = v[Fn]
                    Fn = v_stride*( q*(q+1)*(q+2)/6  +  Fn*(Fn+1)/2  +  k-kk );
                    for ( q = 0; q < dim; q++ )
                      f[q] += wt*v[Fn+q];
                  }
                }
              }
              f += v_stride;
            }
          }
        }
      }
    }
  }

  return true;
}